

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
ImageT<unsigned_short,_3U>::getSFloat
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          ImageT<unsigned_short,_3U> *this,uint32_t numChannels,uint32_t targetBits)

{
  ushort uVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar2;
  uint uVar3;
  uint32_t c;
  ulong uVar4;
  uint uVar5;
  ushort *__dest;
  ulong uVar6;
  uint uVar7;
  uint32_t y;
  uint uVar8;
  uint32_t x;
  uint uVar9;
  float outValue;
  allocator_type local_49;
  uint local_48;
  float local_44;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_40;
  ImageT<unsigned_short,_3U> *local_38;
  
  if (3 < numChannels) {
    __assert_fail("numChannels <= componentCount",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x38e,
                  "virtual std::vector<uint8_t> ImageT<unsigned short, 3>::getSFloat(uint32_t, uint32_t) const [componentType = unsigned short, componentCount = 3]"
                 );
  }
  if ((targetBits != 0x10) && (targetBits != 0x20)) {
    __assert_fail("targetBits == 16 || targetBits == 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x38f,
                  "virtual std::vector<uint8_t> ImageT<unsigned short, 3>::getSFloat(uint32_t, uint32_t) const [componentType = unsigned short, componentCount = 3]"
                 );
  }
  uVar7 = targetBits >> 3;
  local_48 = numChannels;
  local_40 = __return_storage_ptr__;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,
             (ulong)(uVar7 * numChannels * (this->super_Image).height * (this->super_Image).width),
             &local_49);
  uVar6 = (ulong)local_48;
  pvVar2 = local_40;
  uVar3 = local_48;
  local_38 = this;
  for (uVar8 = 0; uVar8 < (this->super_Image).height; uVar8 = uVar8 + 1) {
    for (uVar9 = 0; uVar9 < (this->super_Image).width; uVar9 = uVar9 + 1) {
      for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
        uVar5 = (this->super_Image).width * uVar8 + uVar9;
        uVar1 = this->pixels[uVar5].field_0.comps[uVar4];
        __dest = (ushort *)
                 ((pvVar2->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_start + (uVar5 * uVar3 + (int)uVar4) * uVar7);
        if (targetBits == 0x20) {
          local_44 = (float)uVar1;
          memcpy(__dest,&local_44,(ulong)uVar7);
          pvVar2 = local_40;
          this = local_38;
          uVar3 = local_48;
        }
        else if (targetBits == 0x10) {
          *__dest = uVar1;
        }
      }
    }
  }
  return pvVar2;
}

Assistant:

virtual std::vector<uint8_t> getSFloat(uint32_t numChannels, uint32_t targetBits) const override {
        assert(numChannels <= componentCount);
        assert(targetBits == 16 || targetBits == 32);

        const uint32_t targetBytes = targetBits / 8;
        std::vector<uint8_t> data(height * width * numChannels * targetBytes);

        for (uint32_t y = 0; y < height; ++y) {
            for (uint32_t x = 0; x < width; ++x) {
                for (uint32_t c = 0; c < numChannels; ++c) {
                    const auto value = c < componentCount ? pixels[y * width + x][c] : (c != 3 ? componentType{0} : componentType{1});
                    auto* target = data.data() + (y * width * numChannels + x * numChannels + c) * targetBytes;

                    if (sizeof(componentType) == targetBytes) {
                        *reinterpret_cast<componentType*>(target) = value;
                    } else if (targetBytes == 2) {
                        const auto outValue = imageio::float_to_half(static_cast<float>(value));
                        std::memcpy(target, &outValue, targetBytes);
                    } else if (targetBytes == 4) {
                        const auto outValue = static_cast<float>(value);
                        std::memcpy(target, &outValue, targetBytes);
                    }
                }
            }
        }

        return data;
    }